

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

OPJ_BOOL opj_tls_set(opj_tls_t *tls,int key,void *value,opj_tls_free_func opj_free_func)

{
  opj_tls_key_val_t *poVar1;
  int local_3c;
  int i;
  opj_tls_key_val_t *new_key_val;
  opj_tls_free_func opj_free_func_local;
  void *value_local;
  int key_local;
  opj_tls_t *tls_local;
  
  if (tls->key_val_count == 0x7fffffff) {
    tls_local._4_4_ = 0;
  }
  else {
    for (local_3c = 0; local_3c < tls->key_val_count; local_3c = local_3c + 1) {
      if (tls->key_val[local_3c].key == key) {
        if (tls->key_val[local_3c].opj_free_func != (opj_tls_free_func)0x0) {
          (*tls->key_val[local_3c].opj_free_func)(tls->key_val[local_3c].value);
        }
        tls->key_val[local_3c].value = value;
        tls->key_val[local_3c].opj_free_func = opj_free_func;
        return 1;
      }
    }
    poVar1 = (opj_tls_key_val_t *)opj_realloc(tls->key_val,((long)tls->key_val_count + 1) * 0x18);
    if (poVar1 == (opj_tls_key_val_t *)0x0) {
      tls_local._4_4_ = 0;
    }
    else {
      tls->key_val = poVar1;
      poVar1[tls->key_val_count].key = key;
      poVar1[tls->key_val_count].value = value;
      poVar1[tls->key_val_count].opj_free_func = opj_free_func;
      tls->key_val_count = tls->key_val_count + 1;
      tls_local._4_4_ = 1;
    }
  }
  return tls_local._4_4_;
}

Assistant:

OPJ_BOOL opj_tls_set(opj_tls_t* tls, int key, void* value,
                     opj_tls_free_func opj_free_func)
{
    opj_tls_key_val_t* new_key_val;
    int i;

    if (tls->key_val_count == INT_MAX) {
        return OPJ_FALSE;
    }
    for (i = 0; i < tls->key_val_count; i++) {
        if (tls->key_val[i].key == key) {
            if (tls->key_val[i].opj_free_func) {
                tls->key_val[i].opj_free_func(tls->key_val[i].value);
            }
            tls->key_val[i].value = value;
            tls->key_val[i].opj_free_func = opj_free_func;
            return OPJ_TRUE;
        }
    }
    new_key_val = (opj_tls_key_val_t*) opj_realloc(tls->key_val,
                  ((size_t)tls->key_val_count + 1U) * sizeof(opj_tls_key_val_t));
    if (!new_key_val) {
        return OPJ_FALSE;
    }
    tls->key_val = new_key_val;
    new_key_val[tls->key_val_count].key = key;
    new_key_val[tls->key_val_count].value = value;
    new_key_val[tls->key_val_count].opj_free_func = opj_free_func;
    tls->key_val_count ++;
    return OPJ_TRUE;
}